

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

bool __thiscall Instance::solve(Instance *this)

{
  check_result cVar1;
  clock_t cVar2;
  clock_t cVar3;
  params p;
  params local_30;
  
  cVar2 = clock();
  (**this->_vptr_Instance)(this);
  cVar3 = clock();
  this->constraint_t = ((double)(cVar3 - cVar2) * 1000.0) / 1000000.0 + this->constraint_t;
  local_30.super_object.m_ctx = this->c;
  local_30.m_params = (Z3_params)Z3_mk_params((local_30.super_object.m_ctx)->m_ctx);
  Z3_params_inc_ref((local_30.super_object.m_ctx)->m_ctx,local_30.m_params);
  z3::params::set(&local_30,":timeout",60000);
  Z3_optimize_set_params
            (((this->solver).super_object.m_ctx)->m_ctx,(this->solver).m_opt,local_30.m_params);
  z3::context::check_error((this->solver).super_object.m_ctx);
  cVar2 = clock();
  cVar1 = z3::optimize::check(&this->solver);
  cVar3 = clock();
  this->solve_t = ((double)(cVar3 - cVar2) * 1000.0) / 1000000.0 + this->solve_t;
  z3::params::~params(&local_30);
  return cVar1 == sat;
}

Assistant:

bool Instance::solve() {
  std::clock_t c_start = std::clock();
  enforceConstraints();
  std::clock_t c_end = std::clock();
  constraint_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;

  z3::params p(*c);
  p.set(":timeout", static_cast<unsigned>(1000*60)); //1 minute timout
  solver.set(p);
  c_start = std::clock();
  bool result = solver.check() == sat;
  c_end = std::clock();
  solve_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;
  return result;
}